

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall tetgenmesh::jettisonnodes(tetgenmesh *this)

{
  tetgenio *ptVar1;
  int *piVar2;
  point dyingpoint;
  int iVar3;
  long lVar4;
  
  if (this->b->quiet == 0) {
    puts("Jettisoning redundant points.");
  }
  memorypool::traversalinit(this->points);
  dyingpoint = pointtraverse(this);
  lVar4 = 0;
  iVar3 = 0;
  while (dyingpoint != (point)0x0) {
    if (*(uint *)((long)dyingpoint + (long)this->pointmarkindex * 4 + 4) < 0x200) {
      pointdealloc(this,dyingpoint);
    }
    else {
      ptVar1 = this->in;
      *(int *)((long)dyingpoint + (long)this->pointmarkindex * 4) = ptVar1->firstnumber + iVar3;
      piVar2 = ptVar1->pointmarkerlist;
      if ((piVar2 != (int *)0x0) && (lVar4 < ptVar1->numberofpoints)) {
        piVar2[iVar3] = piVar2[lVar4];
      }
      iVar3 = iVar3 + 1;
    }
    lVar4 = lVar4 + 1;
    dyingpoint = pointtraverse(this);
  }
  if (this->b->verbose != 0) {
    printf("  %ld duplicated vertices are removed.\n",this->dupverts);
    printf("  %ld unused vertices are removed.\n",this->unuverts);
  }
  this->dupverts = 0;
  this->unuverts = 0;
  this->points->deaditemstack = (void *)0x0;
  return;
}

Assistant:

void tetgenmesh::jettisonnodes()
{
  point pointloop;
  bool jetflag;
  int oldidx, newidx;
  int remcount;

  if (!b->quiet) {
    printf("Jettisoning redundant points.\n");
  }

  points->traversalinit();
  pointloop = pointtraverse();
  oldidx = newidx = 0; // in->firstnumber;
  remcount = 0;
  while (pointloop != (point) NULL) {
    jetflag = (pointtype(pointloop) == DUPLICATEDVERTEX) || 
      (pointtype(pointloop) == UNUSEDVERTEX);
    if (jetflag) {
      // It is a duplicated or unused point, delete it.
      pointdealloc(pointloop);
      remcount++;
    } else {
      // Re-index it.
      setpointmark(pointloop, newidx + in->firstnumber);
      if (in->pointmarkerlist != (int *) NULL) {
        if (oldidx < in->numberofpoints) {
          // Re-index the point marker as well.
          in->pointmarkerlist[newidx] = in->pointmarkerlist[oldidx];
        }
      }
      newidx++;
    }
    oldidx++;
    pointloop = pointtraverse();
  }
  if (b->verbose) {
    printf("  %ld duplicated vertices are removed.\n", dupverts);
    printf("  %ld unused vertices are removed.\n", unuverts);
  }
  dupverts = 0l;
  unuverts = 0l;

  // The following line ensures that dead items in the pool of nodes cannot
  //   be allocated for the new created nodes. This ensures that the input
  //   nodes will occur earlier in the output files, and have lower indices.
  points->deaditemstack = (void *) NULL;
}